

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::ShapeFunctionsDerivativeY
          (ChElementShellANCF_3423 *this,ShapeVector *Ny,double x,double y,double z)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  
  dVar1 = this->m_lenY;
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  auVar4._16_8_ = dVar1;
  auVar4._24_8_ = dVar1;
  auVar3 = vdivpd_avx512vl(_DAT_00ef8c60,auVar4);
  dVar1 = z * this->m_thickness * 0.5 * 0.25;
  auVar7._0_8_ = (1.0 - x) * dVar1;
  auVar7._8_8_ = (x + 1.0) * dVar1;
  auVar4 = vpermpd_avx2(ZEXT1632(CONCAT88(x + 1.0,1.0 - x)),0xd4);
  auVar2._8_8_ = 0x3fd0000000000000;
  auVar2._0_8_ = 0x3fd0000000000000;
  auVar2._16_8_ = 0x3fd0000000000000;
  auVar2._24_8_ = 0x3fd0000000000000;
  auVar4 = vmulpd_avx512vl(auVar4,auVar2);
  auVar5 = vpermi2pd_avx512f(_DAT_00ef8ec0,ZEXT3264(auVar4),ZEXT3264(auVar3));
  auVar4 = vblendpd_avx(ZEXT1632(auVar7),auVar3,0xc);
  auVar6 = vpermi2pd_avx512f(_DAT_00ef8f00,ZEXT3264(CONCAT1616(auVar7,auVar3._0_16_)),
                             ZEXT3264(auVar4));
  auVar5 = vmulpd_avx512f(auVar5,auVar6);
  *(undefined1 (*) [64])
   (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array =
       auVar5;
  return;
}

Assistant:

void ChElementShellANCF_3423::ShapeFunctionsDerivativeY(ShapeVector& Ny, double x, double y, double z) {
    double b = GetLengthY();
    double c = m_thickness;

    Ny(0) = 0.25 * (1.0 - x) * (-2.0 / b);
    Ny(1) = z * c / 2.0 * 0.25 * (1.0 - x) * (-2.0 / b);
    Ny(2) = 0.25 * (1.0 + x) * (-2.0 / b);
    Ny(3) = z * c / 2.0 * 0.25 * (1.0 + x) * (-2.0 / b);
    Ny(4) = 0.25 * (1.0 + x) * (2.0 / b);
    Ny(5) = z * c / 2.0 * 0.25 * (1.0 + x) * (2.0 / b);
    Ny(6) = 0.25 * (1.0 - x) * (2.0 / b);
    Ny(7) = z * c / 2.0 * 0.25 * (1.0 - x) * (2.0 / b);
}